

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

StringRef __thiscall llvm::sys::path::remove_leading_dotslash(path *this,StringRef Path,Style style)

{
  char cVar1;
  char *pcVar2;
  StringRef SVar3;
  StringRef local_40;
  
  local_40.Length = (size_t)Path.Data;
  pcVar2 = (char *)local_40.Length;
  local_40.Data = (char *)this;
LAB_00dbef9c:
  do {
    if ((pcVar2 < (char *)0x3) ||
       (cVar1 = StringRef::operator[](&local_40,0), pcVar2 = (char *)local_40.Length, cVar1 != '.'))
    {
LAB_00dbf02d:
      SVar3.Length = (size_t)pcVar2;
      SVar3.Data = local_40.Data;
      return SVar3;
    }
    cVar1 = StringRef::operator[](&local_40,1);
    if ((cVar1 != '/') && (pcVar2 = (char *)local_40.Length, (int)Path.Length != 0 || cVar1 != '\\')
       ) goto LAB_00dbf02d;
    pcVar2 = (char *)0x2;
    if (local_40.Length < (char *)0x2) {
      pcVar2 = (char *)local_40.Length;
    }
    while( true ) {
      local_40.Length = local_40.Length + -(long)pcVar2;
      local_40.Data = pcVar2 + (long)local_40.Data;
      if ((char *)local_40.Length == (char *)0x0) break;
      cVar1 = StringRef::operator[](&local_40,0);
      if ((cVar1 != '/') &&
         (pcVar2 = (char *)local_40.Length, (int)Path.Length != 0 || cVar1 != '\\'))
      goto LAB_00dbef9c;
      pcVar2 = (char *)(ulong)((char *)local_40.Length != (char *)0x0);
    }
    pcVar2 = (char *)0x0;
  } while( true );
}

Assistant:

StringRef remove_leading_dotslash(StringRef Path, Style style) {
  // Remove leading "./" (or ".//" or "././" etc.)
  while (Path.size() > 2 && Path[0] == '.' && is_separator(Path[1], style)) {
    Path = Path.substr(2);
    while (Path.size() > 0 && is_separator(Path[0], style))
      Path = Path.substr(1);
  }
  return Path;
}